

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_cfilter_add(Curl_easy *data,connectdata *conn,int sockindex)

{
  CURLcode CVar1;
  Curl_cfilter *pCStack_28;
  CURLcode result;
  Curl_cfilter *cf;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf._4_4_ = sockindex;
  pcStack_18 = conn;
  conn_local = (connectdata *)data;
  CVar1 = cf_ssl_create(&stack0xffffffffffffffd8,data,conn);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_add((Curl_easy *)conn_local,pcStack_18,cf._4_4_,pCStack_28);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ssl_cfilter_add(struct Curl_easy *data,
                              struct connectdata *conn,
                              int sockindex)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_create(&cf, data, conn);
  if(!result)
    Curl_conn_cf_add(data, conn, sockindex, cf);
  return result;
}